

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,PatternOptions patternOptions)

{
  char *in_RCX;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg;
  char *begin;
  Stream *pSVar1;
  long in_FS_OFFSET;
  QByteArrayView data;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  QByteArrayView data_03;
  QByteArrayView data_04;
  QByteArrayView data_05;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QByteArray local_68;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  dbg = (QDebug *)
        CONCAT44(in_register_00000034,
                 patternOptions.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                 super_QFlagsStorage<QRegularExpression::PatternOption>.i);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,dbg);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char *)0x0;
  local_68.d.size = 0;
  if (in_EDX == 0) {
    QByteArray::operator=(&local_68,"NoPatternOption");
  }
  else {
    QByteArray::reallocData(&local_68,200,KeepSize);
    if ((&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_68.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_68.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_68.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if ((in_EDX & 1) != 0) {
      data.m_data = "CaseInsensitiveOption|";
      data.m_size = 0x16;
      in_RCX = "CaseInsensitiveOption|";
      QByteArray::insert(&local_68,local_68.d.size,data);
    }
    if ((in_EDX & 2) != 0) {
      data_00.m_data = "DotMatchesEverythingOption|";
      data_00.m_size = 0x1b;
      in_RCX = "DotMatchesEverythingOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_00);
    }
    if ((in_EDX & 4) != 0) {
      data_01.m_data = "MultilineOption|";
      data_01.m_size = 0x10;
      in_RCX = "MultilineOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_01);
    }
    if ((in_EDX & 8) != 0) {
      data_02.m_data = "ExtendedPatternSyntaxOption|";
      data_02.m_size = 0x1c;
      in_RCX = "ExtendedPatternSyntaxOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_02);
    }
    if ((in_EDX & 0x10) != 0) {
      data_03.m_data = "InvertedGreedinessOption|";
      data_03.m_size = 0x19;
      in_RCX = "InvertedGreedinessOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_03);
    }
    if ((in_EDX & 0x20) != 0) {
      data_04.m_data = "DontCaptureOption|";
      data_04.m_size = 0x12;
      in_RCX = "DontCaptureOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_04);
    }
    if ((in_EDX & 0x40) != 0) {
      data_05.m_data = "UseUnicodePropertiesOption|";
      data_05.m_size = 0x1b;
      in_RCX = "UseUnicodePropertiesOption|";
      QByteArray::insert(&local_68,local_68.d.size,data_05);
    }
    QByteArray::chop(&local_68,1);
  }
  pSVar1 = dbg->stream;
  pSVar1->space = false;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QRegularExpression::PatternOptions(";
  QString::fromUtf8(&local_40,(QString *)0x23,ba);
  QTextStream::operator<<(&pSVar1->ts,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (dbg->stream->space == true) {
    QTextStream::operator<<(&dbg->stream->ts,' ');
  }
  begin = local_68.d.ptr;
  if (local_68.d.ptr == (char *)0x0) {
    begin = &QByteArray::_empty;
  }
  QDebug::putByteArray(dbg,begin,local_68.d.size,ContainsBinary);
  pSVar1 = dbg->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = dbg->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,')');
  pSVar1 = dbg->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = dbg->stream;
  }
  dbg->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar1;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QRegularExpression::PatternOptions patternOptions)
{
    QDebugStateSaver saver(debug);
    QByteArray flags;

    if (patternOptions == QRegularExpression::NoPatternOption) {
        flags = "NoPatternOption";
    } else {
        flags.reserve(200); // worst case...
        if (patternOptions & QRegularExpression::CaseInsensitiveOption)
            flags.append("CaseInsensitiveOption|");
        if (patternOptions & QRegularExpression::DotMatchesEverythingOption)
            flags.append("DotMatchesEverythingOption|");
        if (patternOptions & QRegularExpression::MultilineOption)
            flags.append("MultilineOption|");
        if (patternOptions & QRegularExpression::ExtendedPatternSyntaxOption)
            flags.append("ExtendedPatternSyntaxOption|");
        if (patternOptions & QRegularExpression::InvertedGreedinessOption)
            flags.append("InvertedGreedinessOption|");
        if (patternOptions & QRegularExpression::DontCaptureOption)
            flags.append("DontCaptureOption|");
        if (patternOptions & QRegularExpression::UseUnicodePropertiesOption)
            flags.append("UseUnicodePropertiesOption|");
        flags.chop(1);
    }

    debug.nospace() << "QRegularExpression::PatternOptions(" << flags << ')';

    return debug;
}